

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIDoubleDecoder::decode(FIDoubleDecoder *this,uint8_t *data,size_t len)

{
  ulong uVar1;
  DeadlyImportError *this_00;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ulong uVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  vector<double,_std::allocator<double>_> value;
  double f;
  undefined1 local_69;
  vector<double,_std::allocator<double>_> local_68;
  FIDoubleDecoder local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((in_RCX & 7) == 0) {
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    std::vector<double,_std::allocator<double>_>::reserve(&local_68,in_RCX >> 3);
    if (in_RCX != 0) {
      uVar3 = 0;
      do {
        uVar1 = *(ulong *)(len + uVar3 * 8);
        local_48 = (FIDoubleDecoder)
                   (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                    (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                    (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                    (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
        if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_48);
        }
        else {
          *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_48;
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = uVar3 + 1;
      } while (in_RCX >> 3 != uVar3);
    }
    local_48 = (FIDoubleDecoder)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::FIDoubleValueImpl,std::allocator<Assimp::FIDoubleValueImpl>,std::vector<double,std::allocator<double>>>
              (a_Stack_40,(FIDoubleValueImpl **)&local_48,
               (allocator<Assimp::FIDoubleValueImpl> *)&local_69,&local_68);
    *this = local_48;
    this[1] = (FIDoubleDecoder)a_Stack_40[0]._M_pi;
    _Var2._M_pi = extraout_RDX;
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 7) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<double> value;
        size_t numDoubles = len / 8;
        value.reserve(numDoubles);
        for (size_t i = 0; i < numDoubles; ++i) {
            long long b0 = data[0], b1 = data[1], b2 = data[2], b3 = data[3], b4 = data[4], b5 = data[5], b6 = data[6], b7 = data[7];
            long long v = (b0 << 56) | (b1 << 48) | (b2 << 40) | (b3 << 32) | (b4 << 24) | (b5 << 16) | (b6 << 8) | b7;
            double f;
            memcpy(&f, &v, 8);
            value.push_back(f);
            data += 8;
        }
        return FIDoubleValue::create(std::move(value));
    }